

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus ParseLossyHeader(ChunkData *chunk_data,WebPInfo *webp_info)

{
  uint3 *puVar1;
  uint3 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint8_t *data_00;
  WebPInfo *webp_info_00;
  uint8_t *puVar9;
  char *pcVar10;
  long in_RSI;
  char *pcVar11;
  long in_RDI;
  int dq_uv_ac;
  int dq_uv_dc;
  int dq_y2_ac;
  int dq_y2_dc;
  int dq_y1_dc;
  int bit;
  int base_q;
  size_t psize;
  size_t part_data_size;
  int i;
  int num_parts;
  uint8_t *part_size;
  int clamp_type;
  int colorspace;
  uint64_t *bit_pos;
  uint64_t bit_position;
  WebPInfoStatus status;
  uint32_t partition0_length;
  int display;
  int profile;
  int key_frame;
  uint32_t bits;
  size_t data_size;
  uint8_t *data;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar12;
  int in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint8_t *in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar13;
  byte bVar14;
  int in_stack_ffffffffffffff9c;
  uint3 *local_60;
  uint local_58;
  uint local_54;
  uint64_t *local_50;
  uint64_t local_48;
  undefined4 uVar15;
  WebPInfoStatus local_4;
  
  puVar1 = *(uint3 **)(in_RDI + 0x10);
  lVar8 = *(long *)(in_RDI + 8) + -8;
  uVar2 = *puVar1;
  uVar3 = (uint)uVar2;
  uVar13 = (uint)(((uVar2 & 1) != 0 ^ 0xffU) & 1);
  uVar4 = (uVar3 & 0xe) >> 1;
  uVar5 = (uVar3 & 0x10) >> 4;
  uVar6 = (uint)(uVar2 >> 5);
  uVar15 = 0;
  local_48 = 0;
  local_50 = &local_48;
  printf("  Parsing lossy bitstream...\n");
  if ((int)uVar4 < 4) {
    if (uVar5 == 0) {
      if (*(int *)(in_RSI + 0x70) != 0) {
        fprintf(_stderr,"Error: %s\n","Frame is not displayable.");
      }
      local_4 = WEBP_INFO_BITSTREAM_ERROR;
    }
    else {
      lVar8 = lVar8 + -3;
      pcVar11 = "No";
      if (uVar13 != 0) {
        pcVar11 = "Yes";
      }
      pcVar10 = "No";
      if (uVar5 != 0) {
        pcVar10 = "Yes";
      }
      printf("  Key frame:        %s\n  Profile:          %d\n  Display:          %s\n  Part. 0 length:   %d\n"
             ,pcVar11,(ulong)uVar4,pcVar10,(ulong)uVar6);
      if (uVar13 == 0) {
        if (*(int *)(in_RSI + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","Non-keyframe detected in lossy bitstream.");
        }
        local_4 = WEBP_INFO_BITSTREAM_ERROR;
      }
      else if (((*(char *)((long)puVar1 + 3) == -99) && ((char)puVar1[1] == '\x01')) &&
              (*(char *)((long)puVar1 + 5) == '*')) {
        printf("  Width:            %d\n  X scale:          %d\n  Height:           %d\n  Y scale:          %d\n"
               ,(ulong)(*(ushort *)((long)puVar1 + 6) & 0x3fff),
               (ulong)(uint)((int)(uint)*(byte *)((long)puVar1 + 7) >> 6),
               (ulong)((ushort)puVar1[2] & 0x3fff),
               (ulong)(uint)((int)(uint)*(byte *)((long)puVar1 + 9) >> 6));
        data_00 = (uint8_t *)((long)puVar1 + 10);
        webp_info_00 = (WebPInfo *)(lVar8 - 7);
        if ((WebPInfo *)(ulong)uVar6 < webp_info_00) {
          iVar7 = GetBits(data_00,(size_t)webp_info_00,1,(int *)&local_54,local_50);
          if (iVar7 == 0) {
            if (*(int *)(in_RSI + 0x70) != 0) {
              fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
            }
            local_4 = WEBP_INFO_TRUNCATED_DATA;
          }
          else {
            iVar7 = GetBits(data_00,(size_t)webp_info_00,1,(int *)&local_58,local_50);
            if (iVar7 == 0) {
              if (*(int *)(in_RSI + 0x70) != 0) {
                fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
              }
              local_4 = WEBP_INFO_TRUNCATED_DATA;
            }
            else {
              printf("  Color space:      %d\n",(ulong)local_54);
              printf("  Clamp type:       %d\n",(ulong)local_58);
              local_4 = ParseLossySegmentHeader
                                  (webp_info_00,(uint8_t *)CONCAT44(uVar3,uVar13),
                                   CONCAT44(uVar4,uVar5),(uint64_t *)CONCAT44(uVar6,uVar15));
              if (local_4 == WEBP_INFO_OK) {
                local_4 = ParseLossyFilterHeader
                                    ((WebPInfo *)
                                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                     in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                                     (uint64_t *)
                                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
                bVar14 = (byte)in_stack_ffffffffffffff9c;
                if (local_4 == WEBP_INFO_OK) {
                  local_60 = (uint3 *)(data_00 + uVar6);
                  iVar7 = GetBits(data_00,(size_t)webp_info_00,2,(int *)&stack0xffffffffffffff9c,
                                  local_50);
                  if (iVar7 == 0) {
                    if (*(int *)(in_RSI + 0x70) != 0) {
                      fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                    }
                    local_4 = WEBP_INFO_TRUNCATED_DATA;
                  }
                  else {
                    uVar3 = 1 << (bVar14 & 0x1f);
                    if ((int)((int)webp_info_00 - uVar6) < (int)((uVar3 - 1) * 3)) {
                      if (*(int *)(in_RSI + 0x70) != 0) {
                        fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                      }
                      local_4 = WEBP_INFO_TRUNCATED_DATA;
                    }
                    else {
                      puVar9 = (uint8_t *)
                               ((long)webp_info_00 + (-(long)(int)((uVar3 - 1) * 3) - (ulong)uVar6))
                      ;
                      printf("  Total partitions: %d\n",(ulong)uVar3);
                      for (uVar13 = 1; (int)uVar13 < (int)uVar3; uVar13 = uVar13 + 1) {
                        in_stack_ffffffffffffff88 = (uint8_t *)(long)(int)(uint)*local_60;
                        if (puVar9 < in_stack_ffffffffffffff88) {
                          if (*(int *)(in_RSI + 0x70) != 0) {
                            fprintf(_stderr,"Error: %s\n","Truncated partition.");
                          }
                          return WEBP_INFO_TRUNCATED_DATA;
                        }
                        printf("  Part. %d length:   %d\n",(ulong)uVar13,in_stack_ffffffffffffff88);
                        puVar9 = puVar9 + -(long)in_stack_ffffffffffffff88;
                        local_60 = (uint3 *)((long)local_60 + 3);
                      }
                      uVar12 = 0;
                      uVar5 = 0;
                      uVar4 = 0;
                      uVar13 = 0;
                      uVar3 = 0;
                      iVar7 = GetBits(data_00,(size_t)webp_info_00,7,(int *)&stack0xffffffffffffff84
                                      ,local_50);
                      if (iVar7 == 0) {
                        if (*(int *)(in_RSI + 0x70) != 0) {
                          fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                        }
                        local_4 = WEBP_INFO_TRUNCATED_DATA;
                      }
                      else {
                        iVar7 = GetBits(data_00,(size_t)webp_info_00,1,
                                        (int *)&stack0xffffffffffffff80,local_50);
                        if (iVar7 == 0) {
                          if (*(int *)(in_RSI + 0x70) != 0) {
                            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                          }
                          local_4 = WEBP_INFO_TRUNCATED_DATA;
                        }
                        else if ((in_stack_ffffffffffffff80 == 0) ||
                                (iVar7 = GetSignedBits(in_stack_ffffffffffffff88,
                                                       CONCAT44(in_stack_ffffffffffffff84,
                                                                in_stack_ffffffffffffff80),
                                                       CONCAT44(uVar12,uVar5),
                                                       (int *)CONCAT44(uVar4,uVar13),
                                                       (uint64_t *)
                                                       CONCAT44(uVar3,in_stack_ffffffffffffff68)),
                                iVar7 != 0)) {
                          iVar7 = GetBits(data_00,(size_t)webp_info_00,1,
                                          (int *)&stack0xffffffffffffff80,local_50);
                          if (iVar7 == 0) {
                            if (*(int *)(in_RSI + 0x70) != 0) {
                              fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                            }
                            local_4 = WEBP_INFO_TRUNCATED_DATA;
                          }
                          else if ((in_stack_ffffffffffffff80 == 0) ||
                                  (iVar7 = GetSignedBits(in_stack_ffffffffffffff88,
                                                         CONCAT44(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80),
                                                         CONCAT44(uVar12,uVar5),
                                                         (int *)CONCAT44(uVar4,uVar13),
                                                         (uint64_t *)
                                                         CONCAT44(uVar3,in_stack_ffffffffffffff68)),
                                  iVar7 != 0)) {
                            iVar7 = GetBits(data_00,(size_t)webp_info_00,1,
                                            (int *)&stack0xffffffffffffff80,local_50);
                            if (iVar7 == 0) {
                              if (*(int *)(in_RSI + 0x70) != 0) {
                                fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                              }
                              local_4 = WEBP_INFO_TRUNCATED_DATA;
                            }
                            else if ((in_stack_ffffffffffffff80 == 0) ||
                                    (iVar7 = GetSignedBits(in_stack_ffffffffffffff88,
                                                           CONCAT44(in_stack_ffffffffffffff84,
                                                                    in_stack_ffffffffffffff80),
                                                           CONCAT44(uVar12,uVar5),
                                                           (int *)CONCAT44(uVar4,uVar13),
                                                           (uint64_t *)
                                                           CONCAT44(uVar3,in_stack_ffffffffffffff68)
                                                          ), iVar7 != 0)) {
                              iVar7 = GetBits(data_00,(size_t)webp_info_00,1,
                                              (int *)&stack0xffffffffffffff80,local_50);
                              if (iVar7 == 0) {
                                if (*(int *)(in_RSI + 0x70) != 0) {
                                  fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                                }
                                local_4 = WEBP_INFO_TRUNCATED_DATA;
                              }
                              else if ((in_stack_ffffffffffffff80 == 0) ||
                                      (iVar7 = GetSignedBits(in_stack_ffffffffffffff88,
                                                             CONCAT44(in_stack_ffffffffffffff84,
                                                                      in_stack_ffffffffffffff80),
                                                             CONCAT44(uVar12,uVar5),
                                                             (int *)CONCAT44(uVar4,uVar13),
                                                             (uint64_t *)
                                                             CONCAT44(uVar3,
                                                  in_stack_ffffffffffffff68)), iVar7 != 0)) {
                                iVar7 = GetBits(data_00,(size_t)webp_info_00,1,
                                                (int *)&stack0xffffffffffffff80,local_50);
                                if (iVar7 == 0) {
                                  if (*(int *)(in_RSI + 0x70) != 0) {
                                    fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                                  }
                                  local_4 = WEBP_INFO_TRUNCATED_DATA;
                                }
                                else if ((in_stack_ffffffffffffff80 == 0) ||
                                        (iVar7 = GetSignedBits(in_stack_ffffffffffffff88,
                                                               CONCAT44(in_stack_ffffffffffffff84,
                                                                        in_stack_ffffffffffffff80),
                                                               CONCAT44(uVar12,uVar5),
                                                               (int *)CONCAT44(uVar4,uVar13),
                                                               (uint64_t *)
                                                               CONCAT44(uVar3,
                                                  in_stack_ffffffffffffff68)), iVar7 != 0)) {
                                  printf("  Base Q:           %d\n",(ulong)in_stack_ffffffffffffff84
                                        );
                                  printf("  DQ Y1 DC:         %d\n",(ulong)uVar12);
                                  printf("  DQ Y2 DC:         %d\n",(ulong)uVar5);
                                  printf("  DQ Y2 AC:         %d\n",(ulong)uVar4);
                                  printf("  DQ UV DC:         %d\n",(ulong)uVar13);
                                  printf("  DQ UV AC:         %d\n",(ulong)uVar3);
                                  if (*local_50 >> 3 < (ulong)uVar6) {
                                    local_4 = WEBP_INFO_OK;
                                  }
                                  else {
                                    if (*(int *)(in_RSI + 0x70) != 0) {
                                      fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                                    }
                                    local_4 = WEBP_INFO_TRUNCATED_DATA;
                                  }
                                }
                                else {
                                  if (*(int *)(in_RSI + 0x70) != 0) {
                                    fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                                  }
                                  local_4 = WEBP_INFO_TRUNCATED_DATA;
                                }
                              }
                              else {
                                if (*(int *)(in_RSI + 0x70) != 0) {
                                  fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                                }
                                local_4 = WEBP_INFO_TRUNCATED_DATA;
                              }
                            }
                            else {
                              if (*(int *)(in_RSI + 0x70) != 0) {
                                fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                              }
                              local_4 = WEBP_INFO_TRUNCATED_DATA;
                            }
                          }
                          else {
                            if (*(int *)(in_RSI + 0x70) != 0) {
                              fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                            }
                            local_4 = WEBP_INFO_TRUNCATED_DATA;
                          }
                        }
                        else {
                          if (*(int *)(in_RSI + 0x70) != 0) {
                            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                          }
                          local_4 = WEBP_INFO_TRUNCATED_DATA;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if (*(int *)(in_RSI + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Bad partition length.");
          }
          local_4 = WEBP_INFO_BITSTREAM_ERROR;
        }
      }
      else {
        if (*(int *)(in_RSI + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","Invalid lossy bitstream signature.");
        }
        local_4 = WEBP_INFO_BITSTREAM_ERROR;
      }
    }
  }
  else {
    if (*(int *)(in_RSI + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","Unknown profile.");
    }
    local_4 = WEBP_INFO_BITSTREAM_ERROR;
  }
  return local_4;
}

Assistant:

static WebPInfoStatus ParseLossyHeader(const ChunkData* const chunk_data,
                                       const WebPInfo* const webp_info) {
  const uint8_t* data = chunk_data->payload_;
  size_t data_size = chunk_data->size_ - CHUNK_HEADER_SIZE;
  const uint32_t bits = (uint32_t)data[0] | (data[1] << 8) | (data[2] << 16);
  const int key_frame = !(bits & 1);
  const int profile = (bits >> 1) & 7;
  const int display = (bits >> 4) & 1;
  const uint32_t partition0_length = (bits >> 5);
  WebPInfoStatus status = WEBP_INFO_OK;
  uint64_t bit_position = 0;
  uint64_t* const bit_pos = &bit_position;
  int colorspace, clamp_type;
  printf("  Parsing lossy bitstream...\n");
  // Calling WebPGetFeatures() in ProcessImageChunk() should ensure this.
  assert(chunk_data->size_ >= CHUNK_HEADER_SIZE + 10);
  if (profile > 3) {
    LOG_ERROR("Unknown profile.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if (!display) {
    LOG_ERROR("Frame is not displayable.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  data += 3;
  data_size -= 3;
  printf("  Key frame:        %s\n"
         "  Profile:          %d\n"
         "  Display:          %s\n"
         "  Part. 0 length:   %d\n",
         key_frame ? "Yes" : "No", profile,
         display ? "Yes" : "No", partition0_length);
  if (key_frame) {
    if (!(data[0] == 0x9d && data[1] == 0x01 && data[2] == 0x2a)) {
      LOG_ERROR("Invalid lossy bitstream signature.");
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    printf("  Width:            %d\n"
           "  X scale:          %d\n"
           "  Height:           %d\n"
           "  Y scale:          %d\n",
           ((data[4] << 8) | data[3]) & 0x3fff, data[4] >> 6,
           ((data[6] << 8) | data[5]) & 0x3fff, data[6] >> 6);
    data += 7;
    data_size -= 7;
  } else {
    LOG_ERROR("Non-keyframe detected in lossy bitstream.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if (partition0_length >= data_size) {
    LOG_ERROR("Bad partition length.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  GET_BITS(colorspace, 1);
  GET_BITS(clamp_type, 1);
  printf("  Color space:      %d\n", colorspace);
  printf("  Clamp type:       %d\n", clamp_type);
  status = ParseLossySegmentHeader(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  status = ParseLossyFilterHeader(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  {  // Partition number and size.
    const uint8_t* part_size = data + partition0_length;
    int num_parts, i;
    size_t part_data_size;
    GET_BITS(num_parts, 2);
    num_parts = 1 << num_parts;
    if ((int)(data_size - partition0_length) < (num_parts - 1) * 3) {
      LOG_ERROR("Truncated lossy bitstream.");
      return WEBP_INFO_TRUNCATED_DATA;
    }
    part_data_size = data_size - partition0_length - (num_parts - 1) * 3;
    printf("  Total partitions: %d\n", num_parts);
    for (i = 1; i < num_parts; ++i) {
      const size_t psize =
          part_size[0] | (part_size[1] << 8) | (part_size[2] << 16);
      if (psize > part_data_size) {
        LOG_ERROR("Truncated partition.");
        return WEBP_INFO_TRUNCATED_DATA;
      }
      printf("  Part. %d length:   %d\n", i, (int)psize);
      part_data_size -= psize;
      part_size += 3;
    }
  }
  // Quantizer.
  {
    int base_q, bit;
    int dq_y1_dc = 0, dq_y2_dc = 0, dq_y2_ac = 0, dq_uv_dc = 0, dq_uv_ac = 0;
    GET_BITS(base_q, 7);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y1_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y2_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y2_ac, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_uv_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_uv_ac, 4);
    printf("  Base Q:           %d\n", base_q);
    printf("  DQ Y1 DC:         %d\n", dq_y1_dc);
    printf("  DQ Y2 DC:         %d\n", dq_y2_dc);
    printf("  DQ Y2 AC:         %d\n", dq_y2_ac);
    printf("  DQ UV DC:         %d\n", dq_uv_dc);
    printf("  DQ UV AC:         %d\n", dq_uv_ac);
  }
  if ((*bit_pos >> 3) >= partition0_length) {
    LOG_ERROR("Truncated lossy bitstream.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  return WEBP_INFO_OK;
}